

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void cftmdl(int n,int l,double *a,double *w)

{
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  long local_60;
  
  lVar6 = (long)l;
  pdVar7 = a;
  for (lVar3 = 0; lVar3 < lVar6; lVar3 = lVar3 + 2) {
    dVar11 = pdVar7[lVar6];
    dVar12 = (pdVar7 + lVar6)[1];
    dVar13 = *pdVar7 - dVar11;
    dVar14 = pdVar7[1] - dVar12;
    dVar15 = pdVar7[lVar6 * 2];
    dVar16 = (pdVar7 + lVar6 * 2)[1];
    dVar17 = pdVar7[lVar6 * 3];
    dVar20 = (pdVar7 + lVar6 * 3)[1];
    dVar18 = dVar15 - dVar17;
    dVar19 = dVar16 - dVar20;
    dVar11 = *pdVar7 + dVar11;
    dVar12 = pdVar7[1] + dVar12;
    dVar15 = dVar15 + dVar17;
    dVar16 = dVar16 + dVar20;
    *pdVar7 = dVar11 + dVar15;
    pdVar7[1] = dVar12 + dVar16;
    pdVar7[lVar6 * 2] = dVar11 - dVar15;
    (pdVar7 + lVar6 * 2)[1] = dVar12 - dVar16;
    pdVar7[lVar6] = dVar13 - dVar19;
    (pdVar7 + lVar6)[1] = dVar18 + dVar14;
    pdVar7[lVar6 * 3] = dVar19 + dVar13;
    (pdVar7 + lVar6 * 3)[1] = dVar14 - dVar18;
    pdVar7 = pdVar7 + 2;
  }
  dVar11 = w[2];
  for (lVar3 = (long)(l * 4); lVar3 < l * 5; lVar3 = lVar3 + 2) {
    dVar16 = a[lVar3 + 1] - a[lVar6 + lVar3 + 1];
    dVar17 = a[lVar6 * 2 + lVar3 + 1] - a[lVar6 * 3 + lVar3 + 1];
    dVar15 = a[lVar6 * 2 + lVar3] - a[lVar6 * 3 + lVar3];
    dVar20 = a[lVar6 + lVar3 + 1] + a[lVar3 + 1];
    dVar13 = a[lVar6 * 3 + lVar3] + a[lVar6 * 2 + lVar3];
    dVar12 = a[lVar3] - a[lVar6 + lVar3];
    dVar14 = a[lVar6 * 3 + lVar3 + 1] + a[lVar6 * 2 + lVar3 + 1];
    dVar18 = a[lVar6 + lVar3] + a[lVar3];
    a[lVar3] = dVar13 + dVar18;
    (a + lVar3)[1] = dVar20 + dVar14;
    a[lVar6 * 2 + lVar3] = dVar14 - dVar20;
    (a + lVar6 * 2 + lVar3)[1] = dVar18 - dVar13;
    dVar20 = dVar12 - dVar17;
    dVar13 = dVar16 + dVar15;
    a[lVar6 + lVar3] = (dVar20 - dVar13) * dVar11;
    a[lVar6 + lVar3 + 1] = (dVar13 + dVar20) * dVar11;
    dVar12 = dVar12 + dVar17;
    dVar15 = dVar15 - dVar16;
    a[lVar6 * 3 + lVar3] = (dVar15 - dVar12) * dVar11;
    a[lVar6 * 3 + lVar3 + 1] = (dVar15 + dVar12) * dVar11;
  }
  lVar8 = (long)(l * 8);
  iVar9 = l * 0xc;
  local_60 = 0;
  lVar3 = 0;
  for (lVar5 = lVar8; lVar5 < n; lVar5 = lVar5 + lVar8) {
    lVar10 = (long)iVar9;
    lVar1 = lVar3 + 2;
    dVar11 = w[lVar3 + 2];
    dVar12 = w[lVar3 + 3];
    dVar15 = w[lVar1 * 2];
    dVar16 = w[lVar1 * 2 + 1];
    dVar20 = dVar15 - (dVar12 + dVar12) * dVar16;
    dVar13 = (dVar12 + dVar12) * dVar15 - dVar16;
    dVar17 = -dVar12;
    for (lVar4 = local_60; lVar8 + lVar4 < lVar5 + lVar6; lVar4 = lVar4 + 2) {
      dVar14 = a[lVar8 + lVar4];
      dVar18 = (a + lVar8 + lVar4)[1];
      dVar19 = a[lVar6 + lVar8 + lVar4];
      dVar24 = (a + lVar6 + lVar8 + lVar4)[1];
      dVar25 = dVar14 + dVar19;
      dVar26 = dVar18 + dVar24;
      dVar21 = a[lVar8 + lVar6 * 2 + lVar4];
      dVar22 = (a + lVar8 + lVar6 * 2 + lVar4)[1];
      dVar2 = a[lVar8 + lVar6 * 3 + lVar4];
      dVar23 = (a + lVar8 + lVar6 * 3 + lVar4)[1];
      dVar27 = dVar21 + dVar2;
      dVar28 = dVar22 + dVar23;
      a[lVar8 + lVar4] = dVar25 + dVar27;
      (a + lVar8 + lVar4)[1] = dVar26 + dVar28;
      dVar25 = dVar25 - dVar27;
      dVar26 = dVar26 - dVar28;
      a[lVar8 + lVar6 * 2 + lVar4] = dVar26 * dVar17 + dVar11 * dVar25;
      (a + lVar8 + lVar6 * 2 + lVar4)[1] = dVar25 * dVar12 + dVar11 * dVar26;
      dVar14 = dVar14 - dVar19;
      dVar18 = dVar18 - dVar24;
      dVar21 = dVar21 - dVar2;
      dVar22 = dVar22 - dVar23;
      dVar19 = dVar14 - dVar22;
      dVar24 = dVar18 - dVar21;
      dVar22 = dVar22 + dVar14;
      dVar21 = dVar21 + dVar18;
      a[lVar6 + lVar8 + lVar4] = dVar21 * -dVar16 + dVar19 * dVar15;
      (a + lVar6 + lVar8 + lVar4)[1] = dVar19 * dVar16 + dVar21 * dVar15;
      a[lVar8 + lVar6 * 3 + lVar4] = dVar24 * -dVar13 + dVar22 * dVar20;
      (a + lVar8 + lVar6 * 3 + lVar4)[1] = dVar22 * dVar13 + dVar24 * dVar20;
    }
    dVar12 = w[lVar3 * 2 + 6];
    dVar15 = w[lVar3 * 2 + 7];
    dVar16 = dVar12 - (dVar11 + dVar11) * dVar15;
    dVar20 = (dVar11 + dVar11) * dVar12 - dVar15;
    for (; lVar10 < l * 4 + lVar5 + lVar6; lVar10 = lVar10 + 2) {
      dVar13 = a[lVar10];
      dVar14 = (a + lVar10)[1];
      dVar18 = a[lVar6 + lVar10];
      dVar19 = (a + lVar6 + lVar10)[1];
      dVar23 = dVar13 + dVar18;
      dVar25 = dVar14 + dVar19;
      dVar24 = a[lVar6 * 2 + lVar10];
      dVar21 = (a + lVar6 * 2 + lVar10)[1];
      dVar22 = a[lVar6 * 3 + lVar10];
      dVar2 = (a + lVar6 * 3 + lVar10)[1];
      dVar26 = dVar24 + dVar22;
      dVar27 = dVar21 + dVar2;
      a[lVar10] = dVar23 + dVar26;
      (a + lVar10)[1] = dVar25 + dVar27;
      dVar23 = dVar23 - dVar26;
      dVar25 = dVar25 - dVar27;
      a[lVar6 * 2 + lVar10] = dVar25 * -dVar11 + dVar17 * dVar23;
      (a + lVar6 * 2 + lVar10)[1] = dVar23 * dVar11 + dVar17 * dVar25;
      dVar13 = dVar13 - dVar18;
      dVar14 = dVar14 - dVar19;
      dVar24 = dVar24 - dVar22;
      dVar21 = dVar21 - dVar2;
      dVar18 = dVar13 - dVar21;
      dVar19 = dVar14 - dVar24;
      dVar21 = dVar21 + dVar13;
      dVar24 = dVar24 + dVar14;
      a[lVar6 + lVar10] = dVar24 * -dVar15 + dVar18 * dVar12;
      (a + lVar6 + lVar10)[1] = dVar18 * dVar15 + dVar24 * dVar12;
      a[lVar6 * 3 + lVar10] = dVar19 * -dVar20 + dVar21 * dVar16;
      (a + lVar6 * 3 + lVar10)[1] = dVar21 * dVar20 + dVar19 * dVar16;
    }
    iVar9 = iVar9 + l * 8;
    local_60 = local_60 + lVar8;
    lVar3 = lVar1;
  }
  return;
}

Assistant:

void cftmdl(int n, int l, double *a, double *w)
{
    int j, j1, j2, j3, k, k1, k2, m, m2;
    double wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    m = l << 2;
    for (j = 0; j < l; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x0r - x2r;
        a[j2 + 1] = x0i - x2i;
        a[j1] = x1r - x3i;
        a[j1 + 1] = x1i + x3r;
        a[j3] = x1r + x3i;
        a[j3 + 1] = x1i - x3r;
    }
    wk1r = w[2];
    for (j = m; j < l + m; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x2i - x0i;
        a[j2 + 1] = x0r - x2r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j1] = wk1r * (x0r - x0i);
        a[j1 + 1] = wk1r * (x0r + x0i);
        x0r = x3i + x1r;
        x0i = x3r - x1i;
        a[j3] = wk1r * (x0i - x0r);
        a[j3 + 1] = wk1r * (x0i + x0r);
    }
    k1 = 0;
    m2 = 2 * m;
    for (k = m2; k < n; k += m2) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        for (j = k; j < l + k; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = wk2r * x0r - wk2i * x0i;
            a[j2 + 1] = wk2r * x0i + wk2i * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        for (j = k + m; j < l + (k + m); j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = -wk2i * x0r - wk2r * x0i;
            a[j2 + 1] = -wk2i * x0i + wk2r * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
    }
}